

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ConvolutionLayerParams::SerializeWithCachedSizes
          (ConvolutionLayerParams *this,CodedOutputStream *output)

{
  uint32 uVar1;
  uint64 uVar2;
  int iVar3;
  int iVar4;
  
  if (this->outputchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->outputchannels_,output);
  }
  if (this->kernelchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->kernelchannels_,output);
  }
  if (this->ngroups_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(10,this->ngroups_,output);
  }
  iVar4 = (this->kernelsize_).current_size_;
  if (0 < iVar4) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0xa2);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_kernelsize_cached_byte_size_);
    iVar4 = (this->kernelsize_).current_size_;
  }
  iVar3 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
    iVar3 = 0;
  }
  for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
    uVar2 = kernelsize(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar2);
  }
  iVar4 = (this->stride_).current_size_;
  if (0 < iVar4) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0xf2);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_stride_cached_byte_size_);
    iVar4 = (this->stride_).current_size_;
  }
  iVar3 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
    uVar2 = stride(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar2);
  }
  iVar4 = (this->dilationfactor_).current_size_;
  if (0 < iVar4) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x142);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_dilationfactor_cached_byte_size_);
    iVar4 = (this->dilationfactor_).current_size_;
  }
  iVar3 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
    uVar2 = dilationfactor(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar2);
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x32) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x32,&((this->ConvolutionPaddingType_).valid_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x33) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x33,&((this->ConvolutionPaddingType_).valid_)->super_MessageLite,output);
  }
  if (this->isdeconvolution_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x3c,true,output);
  }
  if (this->hasbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x46,true,output);
  }
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x5a,&this->weights_->super_MessageLite,output);
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x5b,&this->bias_->super_MessageLite,output);
  }
  iVar4 = (this->outputshape_).current_size_;
  if (0 < iVar4) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x322);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_outputshape_cached_byte_size_);
    iVar4 = (this->outputshape_).current_size_;
  }
  iVar3 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
    uVar2 = outputshape(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar2);
  }
  return;
}

Assistant:

void ConvolutionLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ConvolutionLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 outputChannels = 1;
  if (this->outputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->outputchannels(), output);
  }

  // uint64 kernelChannels = 2;
  if (this->kernelchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->kernelchannels(), output);
  }

  // uint64 nGroups = 10;
  if (this->ngroups() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(10, this->ngroups(), output);
  }

  // repeated uint64 kernelSize = 20;
  if (this->kernelsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(20, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_kernelsize_cached_byte_size_);
  }
  for (int i = 0, n = this->kernelsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->kernelsize(i), output);
  }

  // repeated uint64 stride = 30;
  if (this->stride_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(30, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_stride_cached_byte_size_);
  }
  for (int i = 0, n = this->stride_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->stride(i), output);
  }

  // repeated uint64 dilationFactor = 40;
  if (this->dilationfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(40, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_dilationfactor_cached_byte_size_);
  }
  for (int i = 0, n = this->dilationfactor_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->dilationfactor(i), output);
  }

  // .CoreML.Specification.ValidPadding valid = 50;
  if (has_valid()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      50, *ConvolutionPaddingType_.valid_, output);
  }

  // .CoreML.Specification.SamePadding same = 51;
  if (has_same()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      51, *ConvolutionPaddingType_.same_, output);
  }

  // bool isDeconvolution = 60;
  if (this->isdeconvolution() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(60, this->isdeconvolution(), output);
  }

  // bool hasBias = 70;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(70, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 90;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      90, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 91;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      91, *this->bias_, output);
  }

  // repeated uint64 outputShape = 100;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(100, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ConvolutionLayerParams)
}